

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O2

void lsvm::hashset::copy_into_new_bucket
               (hashset *h,hashbucket **pb,hashbucket **b,uint32_t new_size_indx)

{
  int iVar1;
  hashbucket *ptr;
  hashbucket *phVar2;
  hashbucket *phVar3;
  hashbucket *phVar4;
  
  ptr = *b;
  *b = ptr->next;
  add_new_bucket(h,pb,(uint8_t)new_size_indx);
  h->count = h->count - ptr->count;
  balance_partition(pb);
  iVar1 = (&primes)[ptr->bucket_size_indx];
  phVar2 = ptr;
  while (phVar4 = phVar2 + 1, phVar4 <= ptr + (ulong)(iVar1 - 1) + 1) {
    phVar3 = phVar2 + 1;
    phVar2 = phVar4;
    if (*(void **)&phVar3->count != (void *)0x0) {
      insert_into_partition
                (h,(hash)phVar4->next,h->bits & (ushort)phVar4->next,*(void **)&phVar3->count,true);
    }
  }
  memory::retain(ptr);
  balance_partition(pb);
  return;
}

Assistant:

inline void copy_into_new_bucket(hashset* h, hashbucket** pb, hashbucket** b, uint32_t new_size_indx){

    // remove current bucket from partition and add new bigger one
    hashbucket* ob = *b;
    *b = (*b)->next;
    add_new_bucket(h,pb,new_size_indx);
    h->count -= ob->count;
    
    // rebalance partition
    balance_partition(pb);

    // insert left-over keys into partition
    entry* he = entries(ob); 
    entry* ehe = get_entry(ob,bucket_size(ob)-1); 
    while(he <= ehe){
        if(he->val != null){
            insert_into_partition(h,he->valhash,hashbit(he->valhash,h->bits),he->val,true);
        }
        ++he;
    }
    
    // remove old bucket
    lsvm::memory::retain(ob);

    // rebalance partition
    balance_partition(pb);
}